

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-timer.c
# Opt level: O2

int run_test_timer_start_twice(void)

{
  int iVar1;
  undefined8 uVar2;
  uv_loop_t *loop;
  char *pcVar3;
  uv_timer_t once;
  
  uVar2 = uv_default_loop();
  iVar1 = uv_timer_init(uVar2,&once);
  if (iVar1 == 0) {
    iVar1 = uv_timer_start(&once,never_cb,86400000,0);
    if (iVar1 == 0) {
      iVar1 = uv_timer_start(&once,once_cb,10,0);
      if (iVar1 == 0) {
        uVar2 = uv_default_loop();
        iVar1 = uv_run(uVar2,0);
        if (iVar1 == 0) {
          if (once_cb_called == 1) {
            loop = (uv_loop_t *)uv_default_loop();
            close_loop(loop);
            uVar2 = uv_default_loop();
            iVar1 = uv_loop_close(uVar2);
            if (iVar1 == 0) {
              uv_library_shutdown();
              return 0;
            }
            pcVar3 = "0 == uv_loop_close(uv_default_loop())";
            uVar2 = 0x9a;
          }
          else {
            pcVar3 = "once_cb_called == 1";
            uVar2 = 0x98;
          }
        }
        else {
          pcVar3 = "r == 0";
          uVar2 = 0x96;
        }
      }
      else {
        pcVar3 = "r == 0";
        uVar2 = 0x94;
      }
    }
    else {
      pcVar3 = "r == 0";
      uVar2 = 0x92;
    }
  }
  else {
    pcVar3 = "r == 0";
    uVar2 = 0x90;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-timer.c",
          uVar2,pcVar3);
  abort();
}

Assistant:

TEST_IMPL(timer_start_twice) {
  uv_timer_t once;
  int r;

  r = uv_timer_init(uv_default_loop(), &once);
  ASSERT(r == 0);
  r = uv_timer_start(&once, never_cb, 86400 * 1000, 0);
  ASSERT(r == 0);
  r = uv_timer_start(&once, once_cb, 10, 0);
  ASSERT(r == 0);
  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT(r == 0);

  ASSERT(once_cb_called == 1);

  MAKE_VALGRIND_HAPPY();
  return 0;
}